

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiments.cpp
# Opt level: O2

void FLT(ffe_t *data,uint size,uint skewIndex,uint output_elements)

{
  ffe_t b;
  ffe_t fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ushort uVar6;
  uint uVar7;
  uint i;
  ulong uVar8;
  
  while (1 < size) {
    uVar3 = size >> 1;
    uVar7 = size & 0xfffffffe;
    uVar8 = 0;
    uVar5 = uVar3;
    while (uVar2 = (uint)uVar8, size = uVar3, uVar2 < skewIndex) {
      b = *(ffe_t *)(&DAT_0010408e + uVar8 * 2 + (ulong)uVar3 * 2);
      uVar4 = uVar5;
      for (; uVar8 < uVar2 + uVar3; uVar8 = uVar8 + 1) {
        uVar6 = data[uVar8];
        if (b != 0xffff) {
          fVar1 = mulE(data[uVar4],b);
          uVar6 = uVar6 ^ fVar1;
          data[uVar8] = uVar6;
        }
        data[uVar4] = data[uVar4] ^ uVar6;
        uVar4 = uVar4 + 1;
      }
      uVar5 = uVar5 + uVar7;
      uVar8 = (ulong)(uVar2 + uVar7);
    }
  }
  return;
}

Assistant:

static void FLT(ffe_t* data, const unsigned size, const unsigned skewIndex, const unsigned output_elements)
{
    for (unsigned width = (size >> 1); width > 0; width >>= 1)
    {
        const ffe_t* skewLUT = skewVec + width + skewIndex - 1;

        for (unsigned j = 0; j < output_elements; j += (width << 1))
        {
            const ffe_t skew = skewLUT[j];

            for (unsigned i = j; i < j + width; ++i)
                fft_butterfly(data[i], data[i + width], skew);
        }
    }
}